

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Rep::Rep(Rep *this,Options *opt,WritableFile *f)

{
  FilterPolicy *pFVar1;
  size_t sVar2;
  Comparator *pCVar3;
  Env *pEVar4;
  Logger *pLVar5;
  size_t sVar6;
  bool bVar7;
  undefined3 uVar8;
  undefined4 uVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  undefined5 uVar13;
  FilterBlockBuilder *local_78;
  WritableFile *f_local;
  Options *opt_local;
  Rep *this_local;
  
  bVar7 = opt->reuse_logs;
  uVar8 = *(undefined3 *)&opt->field_0x55;
  pFVar1 = opt->filter_policy;
  (this->options).compression = opt->compression;
  (this->options).reuse_logs = bVar7;
  *(undefined3 *)&(this->options).field_0x55 = uVar8;
  (this->options).filter_policy = pFVar1;
  uVar9 = *(undefined4 *)&opt->field_0x44;
  sVar2 = opt->max_file_size;
  (this->options).block_restart_interval = opt->block_restart_interval;
  *(undefined4 *)&(this->options).field_0x44 = uVar9;
  (this->options).max_file_size = sVar2;
  pCVar3 = opt->comparator;
  bVar7 = opt->create_if_missing;
  bVar11 = opt->error_if_exists;
  bVar12 = opt->paranoid_checks;
  uVar13 = *(undefined5 *)&opt->field_0xb;
  pEVar4 = opt->env;
  pLVar5 = opt->info_log;
  sVar2 = opt->write_buffer_size;
  iVar10 = opt->max_open_files;
  uVar9 = *(undefined4 *)&opt->field_0x2c;
  sVar6 = opt->block_size;
  (this->options).block_cache = opt->block_cache;
  (this->options).block_size = sVar6;
  (this->options).write_buffer_size = sVar2;
  (this->options).max_open_files = iVar10;
  *(undefined4 *)&(this->options).field_0x2c = uVar9;
  (this->options).env = pEVar4;
  (this->options).info_log = pLVar5;
  (this->options).comparator = pCVar3;
  (this->options).create_if_missing = bVar7;
  (this->options).error_if_exists = bVar11;
  (this->options).paranoid_checks = bVar12;
  *(undefined5 *)&(this->options).field_0xb = uVar13;
  bVar7 = opt->reuse_logs;
  uVar8 = *(undefined3 *)&opt->field_0x55;
  pFVar1 = opt->filter_policy;
  (this->index_block_options).compression = opt->compression;
  (this->index_block_options).reuse_logs = bVar7;
  *(undefined3 *)&(this->index_block_options).field_0x55 = uVar8;
  (this->index_block_options).filter_policy = pFVar1;
  uVar9 = *(undefined4 *)&opt->field_0x44;
  sVar2 = opt->max_file_size;
  (this->index_block_options).block_restart_interval = opt->block_restart_interval;
  *(undefined4 *)&(this->index_block_options).field_0x44 = uVar9;
  (this->index_block_options).max_file_size = sVar2;
  pCVar3 = opt->comparator;
  bVar7 = opt->create_if_missing;
  bVar11 = opt->error_if_exists;
  bVar12 = opt->paranoid_checks;
  uVar13 = *(undefined5 *)&opt->field_0xb;
  pEVar4 = opt->env;
  pLVar5 = opt->info_log;
  sVar2 = opt->write_buffer_size;
  iVar10 = opt->max_open_files;
  uVar9 = *(undefined4 *)&opt->field_0x2c;
  sVar6 = opt->block_size;
  (this->index_block_options).block_cache = opt->block_cache;
  (this->index_block_options).block_size = sVar6;
  (this->index_block_options).write_buffer_size = sVar2;
  (this->index_block_options).max_open_files = iVar10;
  *(undefined4 *)&(this->index_block_options).field_0x2c = uVar9;
  (this->index_block_options).env = pEVar4;
  (this->index_block_options).info_log = pLVar5;
  (this->index_block_options).comparator = pCVar3;
  (this->index_block_options).create_if_missing = bVar7;
  (this->index_block_options).error_if_exists = bVar11;
  (this->index_block_options).paranoid_checks = bVar12;
  *(undefined5 *)&(this->index_block_options).field_0xb = uVar13;
  this->file = f;
  this->offset = 0;
  Status::Status(&this->status);
  BlockBuilder::BlockBuilder(&this->data_block,&this->options);
  BlockBuilder::BlockBuilder(&this->index_block,&this->index_block_options);
  std::__cxx11::string::string((string *)&this->last_key);
  this->num_entries = 0;
  this->closed = false;
  if (opt->filter_policy == (FilterPolicy *)0x0) {
    local_78 = (FilterBlockBuilder *)0x0;
  }
  else {
    local_78 = (FilterBlockBuilder *)operator_new(0x90);
    FilterBlockBuilder::FilterBlockBuilder(local_78,opt->filter_policy);
  }
  this->filter_block = local_78;
  this->pending_index_entry = false;
  BlockHandle::BlockHandle(&this->pending_handle);
  std::__cxx11::string::string((string *)&this->compressed_output);
  (this->index_block_options).block_restart_interval = 1;
  return;
}

Assistant:

Rep(const Options& opt, WritableFile* f)
      : options(opt),
        index_block_options(opt),
        file(f),
        offset(0),
        data_block(&options),
        index_block(&index_block_options),
        num_entries(0),
        closed(false),
        filter_block(opt.filter_policy == nullptr
                         ? nullptr
                         : new FilterBlockBuilder(opt.filter_policy)),
        pending_index_entry(false) {
    index_block_options.block_restart_interval = 1;
  }